

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O3

void __thiscall
libtorrent::torrent_info::rename_file(torrent_info *this,file_index_t index,string *new_filename)

{
  int iVar1;
  bool bVar2;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  file_storage::file_path(&local_50,&this->m_files,index,&local_70);
  if (local_50._M_string_length == new_filename->_M_string_length) {
    if (local_50._M_string_length == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_50._M_dataplus._M_p,(new_filename->_M_dataplus)._M_p,
                   local_50._M_string_length);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (!bVar2) {
    copy_on_write(this);
    file_storage::rename_file(&this->m_files,index,new_filename);
  }
  return;
}

Assistant:

void torrent_info::rename_file(file_index_t index, std::string const& new_filename)
	{
		TORRENT_ASSERT(is_loaded());
		if (m_files.file_path(index) == new_filename) return;
		copy_on_write();
		m_files.rename_file(index, new_filename);
	}